

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void c2mir_finish(MIR_context_t ctx)

{
  c2mir_ctx *__ptr;
  long *__ptr_00;
  long lVar1;
  void *__ptr_01;
  char *op;
  
  __ptr = ctx->c2mir_ctx;
  HTAB_tab_str_t_destroy((HTAB_tab_str_t **)(__ptr + 0x120));
  HTAB_tab_str_t_destroy((HTAB_tab_str_t **)(__ptr + 0x128));
  do {
    __ptr_00 = *(long **)(__ptr + 0x100);
    if (__ptr_00 == (long *)0x0) {
      op = "length";
LAB_001496fe:
      mir_varr_assert_fail(op,"void_ptr_t");
    }
    lVar1 = *__ptr_00;
    __ptr_01 = (void *)__ptr_00[2];
    if (lVar1 == 0) {
      if (__ptr_01 != (void *)0x0) {
        free(__ptr_01);
        free(__ptr_00);
        free(__ptr);
        ctx->c2mir_ctx = (c2mir_ctx *)0x0;
        return;
      }
      op = "destroy";
      goto LAB_001496fe;
    }
    if (__ptr_01 == (void *)0x0) {
      op = "pop";
      goto LAB_001496fe;
    }
    *__ptr_00 = lVar1 + -1;
    free(*(void **)((long)__ptr_01 + lVar1 * 8 + -8));
  } while( true );
}

Assistant:

void c2mir_finish (MIR_context_t ctx) {
  struct c2m_ctx **c2m_ctx_ptr = c2m_ctx_loc (ctx), *c2m_ctx = *c2m_ctx_ptr;

  str_finish (c2m_ctx);
  reg_memory_finish (c2m_ctx);
  free (c2m_ctx);
  *c2m_ctx_ptr = NULL;
}